

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O1

int Fl_Text_Editor::kf_default(int c,Fl_Text_Editor *e)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  char s [2];
  ushort local_1a;
  
  iVar3 = 0;
  if (c != 0) {
    iVar2 = isprint(c);
    if ((c == 9) || (iVar3 = 0, iVar2 != 0)) {
      local_1a = (ushort)(byte)c;
      kill_selection(e);
      if (e->insert_mode_ == 0) {
        Fl_Text_Display::overstrike(&e->super_Fl_Text_Display,(char *)&local_1a);
      }
      else {
        Fl_Text_Display::insert(&e->super_Fl_Text_Display,(char *)&local_1a);
      }
      Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
      puVar1 = &(e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      if (((e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.when_ & 1) != 0) {
        Fl_Widget::do_callback
                  ((Fl_Widget *)e,(Fl_Widget *)e,
                   (e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.user_data_);
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int Fl_Text_Editor::kf_default(int c, Fl_Text_Editor* e) {
  // FIXME: this function is a mess! Fix this!
  if (!c || (!isprint(c) && c != '\t')) return 0;
  char s[2] = "\0";
  s[0] = (char)c;
  kill_selection(e);
  if (e->insert_mode()) e->insert(s);
  else e->overstrike(s);
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return 1;
}